

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite_inl.h
# Opt level: O1

bool google::protobuf::internal::WireFormatLite::
     ReadRepeatedPrimitive<unsigned_int,(google::protobuf::internal::WireFormatLite::FieldType)13>
               (int param_1,uint32 tag,CodedInputStream *input,RepeatedField<unsigned_int> *values)

{
  byte bVar1;
  int iVar2;
  int64 iVar3;
  byte *pbVar4;
  ulong uVar5;
  LogMessage *other;
  uint uVar6;
  int iVar8;
  bool bVar9;
  LogFinisher local_75;
  uint local_74;
  uint local_70;
  uint local_6c;
  LogMessage local_68;
  uint32 uVar7;
  
  pbVar4 = input->buffer_;
  if (pbVar4 < input->buffer_end_) {
    bVar1 = *pbVar4;
    uVar7 = (uint32)bVar1;
    uVar6 = (uint)bVar1;
    if (-1 < (char)bVar1) {
      input->buffer_ = pbVar4 + 1;
      bVar9 = true;
      goto LAB_004399cb;
    }
  }
  else {
    uVar7 = 0;
  }
  iVar3 = io::CodedInputStream::ReadVarint32Fallback(input,uVar7);
  uVar6 = (uint)iVar3;
  bVar9 = -1 < iVar3;
LAB_004399cb:
  if (bVar9) {
    if (values->current_size_ == values->total_size_) {
      RepeatedField<unsigned_int>::Reserve(values,values->total_size_ + 1);
    }
    iVar8 = values->current_size_;
    values->current_size_ = iVar8 + 1;
    values->rep_->elements[iVar8] = uVar6;
    bVar9 = true;
    iVar8 = values->total_size_ - values->current_size_;
    if (iVar8 != 0 && values->current_size_ <= values->total_size_) {
      local_70 = tag & 0xff | 0x80;
      local_74 = tag >> 7;
      iVar8 = iVar8 + 1;
      local_6c = tag;
      do {
        if (local_6c < 0x80) {
          pbVar4 = input->buffer_;
          if ((input->buffer_end_ <= pbVar4) || (*pbVar4 != local_6c)) break;
          pbVar4 = pbVar4 + 1;
        }
        else {
          if ((((0x3fff < local_6c) ||
               (pbVar4 = input->buffer_, *(int *)&input->buffer_end_ - (int)pbVar4 < 2)) ||
              (local_70 != *pbVar4)) || (local_74 != pbVar4[1])) break;
          pbVar4 = pbVar4 + 2;
        }
        input->buffer_ = pbVar4;
        if (pbVar4 < input->buffer_end_) {
          bVar1 = *pbVar4;
          uVar5 = (ulong)bVar1;
          uVar7 = (uint32)bVar1;
          if ((char)bVar1 < '\0') goto LAB_00439aa0;
          input->buffer_ = pbVar4 + 1;
          bVar9 = true;
        }
        else {
          uVar7 = 0;
LAB_00439aa0:
          uVar5 = io::CodedInputStream::ReadVarint32Fallback(input,uVar7);
          bVar9 = -1 < (long)uVar5;
        }
        if (!bVar9) goto LAB_00439b2f;
        if (values->total_size_ <= values->current_size_) {
          LogMessage::LogMessage
                    (&local_68,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                     ,0x456);
          other = LogMessage::operator<<
                            (&local_68,"CHECK failed: (current_size_) < (total_size_): ");
          LogFinisher::operator=(&local_75,other);
          LogMessage::~LogMessage(&local_68);
        }
        iVar2 = values->current_size_;
        values->current_size_ = iVar2 + 1;
        values->rep_->elements[iVar2] = (uint)uVar5;
        iVar8 = iVar8 + -1;
      } while (1 < iVar8);
      bVar9 = true;
    }
  }
  else {
LAB_00439b2f:
    bVar9 = false;
  }
  return bVar9;
}

Assistant:

inline bool WireFormatLite::ReadRepeatedPrimitive(
    int,  // tag_size, unused.
    uint32 tag,
    io::CodedInputStream* input,
    RepeatedField<CType>* values) {
  CType value;
  if (!ReadPrimitive<CType, DeclaredType>(input, &value)) return false;
  values->Add(value);
  int elements_already_reserved = values->Capacity() - values->size();
  while (elements_already_reserved > 0 && input->ExpectTag(tag)) {
    if (!ReadPrimitive<CType, DeclaredType>(input, &value)) return false;
    values->AddAlreadyReserved(value);
    elements_already_reserved--;
  }
  return true;
}